

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O3

bool __thiscall ON_Brep::IsValidVertexTopology(ON_Brep *this,int vertex_index,ON_TextLog *text_log)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  ON_BrepVertex *pOVar4;
  int *piVar5;
  ON_BrepEdge *pOVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  uVar11 = (ulong)(uint)vertex_index;
  if (vertex_index < 0 ||
      (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count <=
      vertex_index) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n"
                      ,uVar11);
    return false;
  }
  pOVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
  if (pOVar4[uVar11].m_vertex_index == vertex_index) {
    uVar7 = (ulong)pOVar4[uVar11].m_ei.m_count;
    if ((long)uVar7 < 1) {
      return true;
    }
    piVar5 = pOVar4[uVar11].m_ei.m_a;
    pOVar6 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    uVar10 = 0;
    while( true ) {
      uVar3 = piVar5[uVar10];
      lVar12 = (long)(int)uVar3;
      if ((lVar12 < 0) ||
         ((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count <=
          (int)uVar3)) break;
      if (uVar3 != pOVar6[lVar12].m_edge_index) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar11);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"vertex.m_ei[%d] = %d is a deleted edge.\n",uVar10 & 0xffffffff,
                          (ulong)uVar3);
        goto LAB_00407d3b;
      }
      if ((pOVar6[lVar12].m_vi[0] != vertex_index) && (pOVar6[lVar12].m_vi[1] != vertex_index)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"brep.m_V[%d] vertex or brep.m_E[%d] edge is not valid.\n",uVar11
                          ,(ulong)uVar3);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,
                          "vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[] = [%d,%d]. At least one edge m_vi[] value should be %d.\n"
                          ,uVar10 & 0xffffffff,(ulong)uVar3,(ulong)uVar3,
                          (ulong)(uint)pOVar6[lVar12].m_vi[0],(ulong)(uint)pOVar6[lVar12].m_vi[1],
                          uVar11);
        goto LAB_00407d3b;
      }
      if (uVar10 != 0) {
        uVar9 = 1;
        uVar8 = 0;
        do {
          if (piVar5[uVar8] == uVar3) {
            if ((pOVar6[lVar12].m_vi[0] == vertex_index) && (pOVar6[lVar12].m_vi[1] == vertex_index)
               ) goto LAB_00407c63;
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar11);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,
                              "vertex.m_ei[%d] and vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[0] = %d"
                              ,uVar8 & 0xffffffff,uVar10 & 0xffffffff,(ulong)uVar3,(ulong)uVar3,
                              (ulong)(uint)pOVar6[lVar12].m_vi[0]);
            ON_TextLog::Print(text_log,
                              "and ON_Brep.m_E[%d].m_vi[1] = %d (both m_vi[] values should be %d).\n"
                              ,(ulong)uVar3,(ulong)(uint)pOVar6[lVar12].m_vi[1],uVar11);
            goto LAB_00407d3b;
          }
          uVar8 = uVar8 + 1;
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar8);
      }
LAB_00407c43:
      uVar10 = uVar10 + 1;
      if (uVar10 == uVar7) {
        return true;
      }
    }
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar11);
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"vertex.m_ei[%d] = %d (should be >=0 and <%d).\n",uVar10 & 0xffffffff
                      ,(ulong)uVar3,
                      (ulong)(uint)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                                   super_ON_ClassArray<ON_BrepEdge>.m_count);
  }
  else {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index);
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"vertex.m_vertex_index = %d (should be %d).\n",
                      (ulong)(uint)pOVar4[uVar11].m_vertex_index,uVar11);
  }
LAB_00407d3b:
  ON_TextLog::PopIndent(text_log);
  return false;
LAB_00407c63:
  if (uVar10 <= uVar9) goto LAB_00407c43;
  uVar1 = uVar9 + 1;
  puVar2 = (uint *)(piVar5 + uVar9);
  uVar9 = uVar1;
  if (*puVar2 == uVar3) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",uVar11);
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"vertex.m_ei[%d,%d,%d] = %d. An open edge index should appear once\n"
                      ,uVar8 & 0xffffffff,uVar10 & 0xffffffff,(ulong)((int)uVar1 - 1),(ulong)uVar3);
    ON_TextLog::Print(text_log,"in vertex.m_ei[] and a closed edge index should appear twice.\n");
    goto LAB_00407d3b;
  }
  goto LAB_00407c63;
}

Assistant:

bool
ON_Brep::IsValidVertexTopology( int vertex_index, ON_TextLog* text_log ) const
{
  if ( vertex_index < 0 || vertex_index >= m_V.Count() )
  {
    if ( text_log )
      text_log->Print("brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                      vertex_index, m_V.Count());
    return false;
  }
  const ON_BrepVertex& vertex = m_V[vertex_index];
  if ( vertex.m_vertex_index != vertex_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_vertex_index = %d (should be %d).\n",
                       vertex.m_vertex_index, vertex_index );
      text_log->PopIndent();
    }
    return false;
  }

  const int vertex_edge_count = vertex.m_ei.Count();
  int i, j, vei, ei;
  for ( vei = 0; vei < vertex_edge_count; vei++ ) 
  {
    ei = vertex.m_ei[vei];

    if ( ei < 0 || ei >= m_E.Count() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d (should be >=0 and <%d).\n", vei, ei, m_E.Count());
        text_log->PopIndent();
      }
      return false;
    }

    const ON_BrepEdge& edge = m_E[ei];

    if ( ei != edge.m_edge_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d is a deleted edge.\n", vei, ei);
        text_log->PopIndent();
      }
      return false;
    }

    if ( edge.m_vi[0] != vertex_index && edge.m_vi[1] != vertex_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_V[%d] vertex or brep.m_E[%d] edge is not valid.\n",vertex_index,ei);
        text_log->PushIndent();
        text_log->Print("vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[] = [%d,%d]. "
                        "At least one edge m_vi[] value should be %d.\n",
                        vei,ei,ei,edge.m_vi[0],edge.m_vi[1],vertex_index);
        text_log->PopIndent();
      }
      return false;
    }

    for ( i = 0; i < vei; i++ ) 
    {
      if ( vertex.m_ei[i] == ei ) 
      {
        // edge should be closed
        if ( edge.m_vi[0] != vertex_index || edge.m_vi[1] != vertex_index )
        {
          if ( text_log )
          {
            text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
            text_log->PushIndent();
            text_log->Print("vertex.m_ei[%d] and vertex.m_ei[%d] = %d but brep.m_E[%d].m_vi[0] = %d",
                             i,vei,ei,ei,edge.m_vi[0]);
            text_log->Print("and ON_Brep.m_E[%d].m_vi[1] = %d (both m_vi[] values should be %d).\n",
                            ei,edge.m_vi[1],vertex_index);
            text_log->PopIndent();
          }
          return false;
        }
        for (j = i+1; j < vei; j++ ) 
        {
          if ( vertex.m_ei[j] == ei )
          {
            if ( text_log )
            {
              text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
              text_log->PushIndent();
              text_log->Print("vertex.m_ei[%d,%d,%d] = %d. An open edge index should appear once\n",i,vei,j,ei);
              text_log->Print("in vertex.m_ei[] and a closed edge index should appear twice.\n");
              text_log->PopIndent();
            }
            return false;
          }
        }
        break;
      }
    }

  }

  return true;
}